

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenu.cpp
# Opt level: O0

bool __thiscall DOptionMenu::Responder(DOptionMenu *this,event_t *ev)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int scrollamt;
  event_t *ev_local;
  DOptionMenu *this_local;
  
  if (ev->type == '\x04') {
    if (ev->subtype == '\x10') {
      iVar2 = MIN<int>(2,this->mDesc->mScrollPos);
      this->mDesc->mScrollPos = this->mDesc->mScrollPos - iVar2;
      return true;
    }
    if (ev->subtype == '\x11') {
      if ((this->CanScrollDown & 1U) != 0) {
        iVar2 = this->VisBottom;
        uVar3 = TArray<FOptionMenuItem_*,_FOptionMenuItem_*>::Size
                          (&(this->mDesc->mItems).super_TArray<FOptionMenuItem_*,_FOptionMenuItem_*>
                          );
        if (iVar2 < (int)(uVar3 - 2)) {
          this->mDesc->mScrollPos = this->mDesc->mScrollPos + 2;
          this->VisBottom = this->VisBottom + 2;
        }
        else {
          this->mDesc->mScrollPos = this->mDesc->mScrollPos + 1;
          this->VisBottom = this->VisBottom + 1;
        }
      }
      return true;
    }
  }
  bVar1 = DMenu::Responder(&this->super_DMenu,ev);
  return bVar1;
}

Assistant:

bool DOptionMenu::Responder (event_t *ev)
{
	if (ev->type == EV_GUI_Event)
	{
		if (ev->subtype == EV_GUI_WheelUp)
		{
			int scrollamt = MIN(2, mDesc->mScrollPos);
			mDesc->mScrollPos -= scrollamt;
			return true;
		}
		else if (ev->subtype == EV_GUI_WheelDown)
		{
			if (CanScrollDown)
			{
				if (VisBottom < (int)(mDesc->mItems.Size()-2))
				{
					mDesc->mScrollPos += 2;
					VisBottom += 2;
				}
				else
				{
					mDesc->mScrollPos++;
					VisBottom++;
				}
			}
			return true;
		}
	}
	return Super::Responder(ev);
}